

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreePrevious(BtCursor *pCur,int *pRes)

{
  uint uVar1;
  MemPage *pMVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  
  *pRes = 0;
  pCur->curFlags = pCur->curFlags & 0xf1;
  (pCur->info).nSize = 0;
  if (pCur->eState == '\x01') {
    cVar3 = pCur->iPage;
    if ((pCur->aiIdx[cVar3] != 0) && (pCur->apPage[cVar3]->leaf != '\0')) {
      pCur->aiIdx[cVar3] = pCur->aiIdx[cVar3] - 1;
      return 0;
    }
  }
  bVar4 = pCur->eState;
  if (bVar4 != 1) {
    if (2 < bVar4) {
      iVar5 = btreeRestoreCursorPosition(pCur);
      if (iVar5 != 0) {
        return iVar5;
      }
      bVar4 = pCur->eState;
    }
    if (bVar4 == 0) {
LAB_00132b77:
      *pRes = 1;
      return 0;
    }
    iVar5 = pCur->skipNext;
    if (iVar5 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (iVar5 < 0) {
        return 0;
      }
    }
  }
  cVar3 = pCur->iPage;
  pMVar2 = pCur->apPage[cVar3];
  if (pMVar2->leaf == '\0') {
    uVar1 = *(uint *)(pMVar2->aData +
                     (CONCAT11(pMVar2->aCellIdx[(ulong)pCur->aiIdx[cVar3] * 2],
                               pMVar2->aCellIdx[(ulong)pCur->aiIdx[cVar3] * 2 + 1]) &
                     pMVar2->maskPage));
    iVar5 = moveToChild(pCur,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                             uVar1 << 0x18);
    if (iVar5 == 0) {
      iVar5 = moveToRightmost(pCur);
      return iVar5;
    }
  }
  else {
    while( true ) {
      if (pCur->aiIdx[cVar3] != 0) break;
      if (cVar3 == '\0') {
        pCur->eState = '\0';
        goto LAB_00132b77;
      }
      moveToParent(pCur);
      cVar3 = pCur->iPage;
    }
    pCur->aiIdx[cVar3] = pCur->aiIdx[cVar3] - 1;
    iVar5 = 0;
    if ((pCur->apPage[cVar3]->intKey != '\0') && (pCur->apPage[cVar3]->leaf == '\0')) {
      iVar5 = sqlite3BtreePrevious(pCur,pRes);
      return iVar5;
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int *pRes){
  assert( cursorOwnsBtShared(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  *pRes = 0;
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey);
  pCur->info.nSize = 0;
  if( pCur->eState!=CURSOR_VALID
   || pCur->aiIdx[pCur->iPage]==0
   || pCur->apPage[pCur->iPage]->leaf==0
  ){
    return btreePrevious(pCur, pRes);
  }
  pCur->aiIdx[pCur->iPage]--;
  return SQLITE_OK;
}